

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inlining.cpp
# Opt level: O3

void wasm::anon_unknown_18::doCodeInlining
               (Module *module,Function *into,InliningAction *action,PassOptions *options)

{
  size_type *psVar1;
  HeapType *this;
  Type *this_00;
  ExpressionList *items;
  Module **__x;
  BranchSeeker *this_01;
  Function *this_02;
  char *pcVar2;
  uintptr_t uVar3;
  long lVar4;
  undefined1 auVar5 [16];
  size_t sVar6;
  PassOptions *pPVar7;
  size_t sVar8;
  char cVar9;
  char cVar10;
  bool bVar11;
  Index IVar12;
  uint uVar13;
  Function *pFVar14;
  Drop *left;
  undefined8 *puVar15;
  long *plVar16;
  size_t sVar17;
  Type TVar18;
  mapped_type *pmVar19;
  Block *pBVar20;
  pointer pTVar21;
  LocalSet *pLVar22;
  Break *pBVar23;
  Block *pBVar24;
  Expression *pEVar25;
  undefined1 reuse;
  size_type *psVar26;
  size_t *psVar27;
  ulong uVar28;
  function<bool_(wasm::Name)> *pfVar29;
  Type *pTVar30;
  uint uVar31;
  Expression **ppEVar32;
  MixedArena *this_03;
  pointer pcVar33;
  Type TVar34;
  string *in_R9;
  Function *pFVar35;
  byte bVar36;
  Signature SVar37;
  string_view sVar38;
  Name NVar39;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  optional<wasm::Type> type_01;
  optional<wasm::Type> type_02;
  Name root;
  Name root_00;
  optional<wasm::Type> type_;
  Name root_01;
  Name name_00;
  optional<wasm::Type> type__00;
  initializer_list<wasm::Expression_*> local_338;
  Expression *local_328 [2];
  Expression local_318;
  long *local_308 [2];
  long local_2f8 [2];
  undefined1 auStack_2e8 [8];
  Updater updater;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  *local_178;
  Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *local_170;
  code *local_168;
  code *local_160;
  NameSet *local_158;
  undefined8 local_150;
  code *local_148;
  code *local_140;
  Expression local_138;
  Expression local_128;
  undefined1 auStack_118 [8];
  Name name_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  Block *local_d8;
  Expression *contents;
  size_type local_c8;
  code *local_c0;
  code *local_b8;
  Module *local_b0;
  _Storage<wasm::Type,_true> local_a8;
  char *local_a0;
  undefined1 auStack_98 [8];
  string __str;
  function<bool_(wasm::Name)> *local_58;
  Drop *local_40;
  Expression *old;
  Builder builder;
  
  this_01 = (BranchSeeker *)*action->callSite;
  if (*(char *)&(this_01->
                super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                ).
                super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                .replacep != '\x06') {
    __assert_fail("int(_id) == int(T::SpecificId)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                  ,0x31b,"T *wasm::Expression::cast() [T = wasm::Call]");
  }
  this_02 = action->contents;
  pFVar14 = Module::getFunction(module,(Name)(this_01->
                                             super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                             ).
                                             super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                             .stack.fixed._M_elems[2]);
  SVar37 = HeapType::getSignature(&pFVar14->type);
  local_a8 = (_Storage<wasm::Type,_true>)SVar37.results.id;
  local_b0 = module;
  old = (Expression *)module;
  left = (Drop *)MixedArena::allocSpace(&module->allocator,0x40,8);
  (left->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = BlockId;
  (left->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
  left->value = (Expression *)0x0;
  *(uintptr_t *)&left[1].super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression = 0;
  left[1].super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id = 0;
  left[1].value = (Expression *)0x0;
  *(undefined8 *)&left[2].super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression = 0;
  left[2].super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id =
       (uintptr_t)&module->allocator;
  auStack_2e8 = (undefined1  [8])
                &updater.
                 super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                 .
                 super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                 .
                 super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                 .stack;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_2e8,"__inlined_func$","");
  pcVar2 = (this_02->super_Importable).super_Named.name.super_IString.str._M_str;
  psVar1 = &__str._M_string_length;
  auStack_98 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)auStack_98,pcVar2,
             pcVar2 + (this_02->super_Importable).super_Named.name.super_IString.str._M_len);
  pcVar33 = (pointer)0xf;
  if (auStack_2e8 !=
      (undefined1  [8])
      &updater.
       super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
       .
       super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
       .
       super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
       .stack) {
    pcVar33 = (pointer)updater.
                       super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                       .
                       super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                       .
                       super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                       .stack.usedFixed;
  }
  TVar34.id = (uintptr_t)
              updater.
              super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
              .
              super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
              .
              super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
              .replacep;
  if (pcVar33 < __str._M_dataplus._M_p +
                (long)updater.
                      super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                      .
                      super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                      .
                      super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                      .replacep) {
    pcVar33 = (pointer)0xf;
    if (auStack_98 != (undefined1  [8])psVar1) {
      pcVar33 = (pointer)__str._M_string_length;
    }
    if (pcVar33 < __str._M_dataplus._M_p +
                  (long)updater.
                        super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                        .
                        super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                        .
                        super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                        .replacep) goto LAB_008e8290;
    puVar15 = (undefined8 *)
              std::__cxx11::string::replace((ulong)auStack_98,0,(char *)0x0,(ulong)auStack_2e8);
  }
  else {
LAB_008e8290:
    puVar15 = (undefined8 *)std::__cxx11::string::_M_append(auStack_2e8,(ulong)auStack_98);
  }
  name_1.super_IString.str._M_str = (char *)&name._M_string_length;
  psVar26 = puVar15 + 2;
  if ((size_type *)*puVar15 == psVar26) {
    name._M_string_length = *psVar26;
    name.field_2._M_allocated_capacity = puVar15[3];
  }
  else {
    name._M_string_length = *psVar26;
    name_1.super_IString.str._M_str = (char *)*puVar15;
  }
  name._M_dataplus._M_p = (pointer)puVar15[1];
  *puVar15 = psVar26;
  puVar15[1] = 0;
  *(char *)psVar26 = '\0';
  if (auStack_98 != (undefined1  [8])psVar1) {
    operator_delete((void *)auStack_98,__str._M_string_length + 1);
  }
  reuse = SUB81(psVar26,0);
  if (auStack_2e8 !=
      (undefined1  [8])
      &updater.
       super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
       .
       super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
       .
       super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
       .stack) {
    operator_delete((void *)auStack_2e8,
                    updater.
                    super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                    .
                    super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                    .
                    super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                    .stack.usedFixed + 1);
  }
  uVar13 = action->nameHint;
  if (uVar13 != 0) {
    cVar10 = '\x01';
    if (9 < uVar13) {
      uVar31 = uVar13;
      cVar9 = '\x04';
      do {
        cVar10 = cVar9;
        if (uVar31 < 100) {
          cVar10 = cVar10 + -2;
          goto LAB_008e8395;
        }
        if (uVar31 < 1000) {
          cVar10 = cVar10 + -1;
          goto LAB_008e8395;
        }
        if (uVar31 < 10000) goto LAB_008e8395;
        bVar11 = 99999 < uVar31;
        uVar31 = uVar31 / 10000;
        cVar9 = cVar10 + '\x04';
      } while (bVar11);
      cVar10 = cVar10 + '\x01';
    }
LAB_008e8395:
    auStack_98 = (undefined1  [8])psVar1;
    std::__cxx11::string::_M_construct((ulong)auStack_98,cVar10);
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)auStack_98,(uint)__str._M_dataplus._M_p,uVar13);
    plVar16 = (long *)std::__cxx11::string::insert((ulong)auStack_98,0,'\x01');
    auStack_2e8 = (undefined1  [8])
                  &updater.
                   super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                   .
                   super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                   .
                   super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                   .stack;
    psVar27 = (size_t *)(plVar16 + 2);
    if ((SmallVector<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_10UL>
         *)*plVar16 ==
        (SmallVector<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_10UL>
         *)psVar27) {
      updater.
      super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
      .stack.usedFixed = *psVar27;
      updater.
      super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
      .stack.fixed._M_elems[0].func = (TaskFunc)plVar16[3];
    }
    else {
      updater.
      super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
      .stack.usedFixed = *psVar27;
      auStack_2e8 = (undefined1  [8])*plVar16;
    }
    updater.
    super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .replacep = (Expression **)plVar16[1];
    *plVar16 = (long)psVar27;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&name_1.super_IString.str._M_str,(ulong)auStack_2e8);
    reuse = SUB81(psVar27,0);
    if (auStack_2e8 !=
        (undefined1  [8])
        &updater.
         super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
         .
         super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
         .
         super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
         .stack) {
      operator_delete((void *)auStack_2e8,
                      updater.
                      super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                      .
                      super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                      .
                      super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                      .stack.usedFixed + 1);
    }
    if (auStack_98 != (undefined1  [8])psVar1) {
      operator_delete((void *)auStack_98,__str._M_string_length + 1);
    }
  }
  sVar38._M_str = (char *)0x0;
  sVar38._M_len = (size_t)name_1.super_IString.str._M_str;
  sVar38 = IString::interned((IString *)name._M_dataplus._M_p,sVar38,(bool)reuse);
  *(string_view *)&left->value = sVar38;
  bVar36 = action->insideATry &
           *(byte *)&(this_01->
                     super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                     ).
                     super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                     .stack.fixed._M_elems[3].func;
  pEVar25 = this_02->body;
  auStack_98 = (undefined1  [8])pEVar25;
  if (sVar38._M_str == (char *)0x0) {
LAB_008e851f:
    if (bVar36 != 0) goto LAB_008e86f2;
    NVar39.super_IString.str._M_str = (char *)pEVar25;
    NVar39.super_IString.str._M_len =
         *(uintptr_t *)&left[1].super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression;
    bVar11 = BranchUtils::BranchSeeker::has(this_01,left->value,NVar39);
    if (!bVar11) goto LAB_008e86f2;
  }
  else {
    auStack_2e8 = (undefined1  [8])0x0;
    updater.
    super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .replacep = (Expression **)0x0;
    updater.
    super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .currFunction = (Function *)0x0;
    updater.module._0_1_ = '\0';
    updater.
    super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .stack.fixed._M_elems[9].currp = (Expression **)0x0;
    updater.
    super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    updater.
    super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    updater.
    super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    updater.
    super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .currModule._0_1_ = (undefined1)sVar38._M_len;
    updater.
    super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .currModule._1_7_ = sVar38._M_len._1_7_;
    updater.
    super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .tryDepth._0_4_ = sVar38._M_str._0_4_;
    updater.
    super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .tryDepth._4_4_ = sVar38._M_str._4_4_;
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::walk
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)auStack_2e8,
               (Expression **)auStack_98);
    cVar10 = (char)updater.module;
    if (updater.
        super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
        .
        super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
        .
        super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
        .stack.fixed._M_elems[9].currp != (Expression **)0x0) {
      operator_delete(updater.
                      super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                      .
                      super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                      .
                      super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                      .stack.fixed._M_elems[9].currp,
                      (long)updater.
                            super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                            .
                            super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                            .
                            super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                            .stack.flexible.
                            super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)updater.
                            super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                            .
                            super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                            .
                            super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                            .stack.fixed._M_elems[9].currp);
    }
    if (cVar10 == '\0') goto LAB_008e851f;
  }
  local_a0 = (char *)CONCAT71(local_a0._1_7_,bVar36);
  contents = this_02->body;
  updater.localMapping._M_t._M_impl._0_8_ =
       &updater.
        super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
        .tryDepth;
  auStack_2e8 = (undefined1  [8])0x0;
  updater.
  super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .replacep = (Expression **)0x0;
  updater.
  super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .stack.fixed._M_elems[9].currp = (Expression **)0x0;
  updater.
  super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  updater.
  super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  updater.
  super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  updater.
  super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .currFunction = (Function *)0x0;
  updater.
  super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .tryDepth._0_4_ = 0;
  updater.module._0_1_ = '\0';
  updater.module._1_7_ = 0;
  updater.localMapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  updater.localMapping._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       updater.localMapping._M_t._M_impl._0_8_;
  Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::walk
            ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)auStack_2e8,
             &contents);
  __x = &updater.
         super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
         .
         super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
         .
         super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
         .currModule;
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
              *)auStack_98,
             (_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
              *)__x);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)__x);
  if (updater.
      super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
      .stack.fixed._M_elems[9].currp != (Expression **)0x0) {
    operator_delete(updater.
                    super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                    .
                    super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                    .
                    super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                    .stack.fixed._M_elems[9].currp,
                    (long)updater.
                          super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                          .
                          super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                          .
                          super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                          .stack.flexible.
                          super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)updater.
                          super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                          .
                          super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                          .
                          super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                          .stack.fixed._M_elems[9].currp);
  }
  if ((byte)local_a0 == '\0') {
    BranchUtils::BranchAccumulator::get((NameSet *)auStack_2e8,(Expression *)this_01);
  }
  else {
    updater.
    super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .stack.fixed._M_elems[0].func = (TaskFunc)&updater;
    auStack_2e8 = (undefined1  [8])0x0;
    updater.
    super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .replacep = (Expression **)0x0;
    updater.
    super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .stack.usedFixed = 0;
    updater.
    super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .stack.fixed._M_elems[1].func = (TaskFunc)0x0;
    updater.
    super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
    .stack.fixed._M_elems[0].currp =
         (Expression **)
         updater.
         super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
         .
         super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
         .
         super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
         .stack.fixed._M_elems[0].func;
  }
  pEVar25 = left->value;
  uVar3 = *(uintptr_t *)&left[1].super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression
  ;
  local_160 = std::
              _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp:497:52)>
              ::_M_invoke;
  local_168 = std::
              _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp:497:52)>
              ::_M_manager;
  local_328[0] = &local_318;
  local_178 = (_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)auStack_98;
  local_170 = (Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)auStack_2e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"_","");
  TVar34.id = (uintptr_t)local_328;
  root.super_IString.str._M_str = (char *)&local_178;
  root.super_IString.str._M_len = uVar3;
  NVar39 = Names::getValidName((Names *)pEVar25,root,(function<bool_(wasm::Name)> *)0x0,
                               (Index)TVar34.id,in_R9);
  *(IString *)&left->value = NVar39.super_IString.str;
  if (local_328[0] != &local_318) {
    operator_delete(local_328[0],local_318._0_8_ + 1);
  }
  bVar36 = (byte)local_a0;
  if (local_168 != (code *)0x0) {
    (*local_168)(&local_178,&local_178,3);
  }
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)auStack_2e8);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)auStack_98);
LAB_008e86f2:
  updater.localMapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&updater.localMapping;
  auStack_2e8 = (undefined1  [8])0x0;
  updater.
  super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .replacep = (Expression **)0x0;
  updater.
  super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  updater.
  super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .stack.fixed._M_elems[9].currp = (Expression **)0x0;
  updater.
  super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  updater.
  super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .currFunction = (Function *)0x0;
  updater.
  super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .currModule._0_1_ = 0;
  updater.
  super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .currModule._1_7_ = 0;
  updater.localMapping._M_t._M_impl._0_8_ =
       updater.localMapping._M_t._M_impl._0_8_ & 0xffffffff00000000;
  uVar28 = 0;
  updater.localMapping._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  updater.localMapping._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  updater.localMapping._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  updater.localMapping._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  updater.returnName.super_IString.str._M_len = 0;
  updater.returnName.super_IString.str._M_str = (char *)0x0;
  updater.options = (PassOptions *)0x0;
  updater.returnCallInfos.
  super__Vector_base<wasm::(anonymous_namespace)::Updater::ReturnCallInfo,_std::allocator<wasm::(anonymous_namespace)::Updater::ReturnCallInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  updater.returnCallInfos.
  super__Vector_base<wasm::(anonymous_namespace)::Updater::ReturnCallInfo,_std::allocator<wasm::(anonymous_namespace)::Updater::ReturnCallInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  updater.
  super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .tryDepth._0_4_ = SUB84(local_b0,0);
  updater.
  super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .tryDepth._4_4_ = (undefined4)((ulong)local_b0 >> 0x20);
  this = &this_02->type;
  updater.
  super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)into;
  updater.localMapping._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       updater.localMapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  updater.builder = (Builder *)options;
  SVar37 = HeapType::getSignature(this);
  updater.returnName.super_IString.str._M_str = (char *)SVar37.results.id;
  pTVar30 = &(left->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type;
  updater.localMapping._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)left->value;
  updater.returnName.super_IString.str._M_len =
       *(size_t *)&left[1].super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression;
  updater.resultType.id._0_1_ =
       *(undefined1 *)
        &(this_01->
         super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
         ).
         super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
         .stack.fixed._M_elems[3].func;
  updater._304_8_ = &old;
  while( true ) {
    auStack_98._0_4_ = (int)uVar28;
    sVar17 = Function::getNumLocals(this_02);
    if (sVar17 <= uVar28) break;
    TVar18 = Function::getLocalType(this_02,auStack_98._0_4_);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = TVar18.id;
    IVar12 = Builder::addVar((Builder *)into,(Function *)0x0,(Name)(auVar5 << 0x40),TVar34);
    pmVar19 = std::
              map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
              ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                            *)&updater.module,(key_type *)auStack_98);
    *pmVar19 = IVar12;
    uVar28 = (ulong)(auStack_98._0_4_ + 1);
  }
  if (bVar36 == 0) {
    this_00 = &left[1].super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type;
    uVar13 = 0;
    name.field_2._8_8_ = action;
    while( true ) {
      contents = (Expression *)CONCAT44(contents._4_4_,uVar13);
      SVar37 = HeapType::getSignature(this);
      auStack_98 = (undefined1  [8])SVar37.params.id;
      sVar17 = wasm::Type::size((Type *)auStack_98);
      action = (InliningAction *)name.field_2._8_8_;
      if (sVar17 <= uVar13) break;
      pmVar19 = std::
                map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                              *)&updater.module,(key_type *)&contents);
      if ((this_01->
          super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
          ).
          super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
          .stack.fixed._M_elems[0].currp <= (Expression **)((ulong)contents & 0xffffffff))
      goto LAB_008e934a;
      pLVar22 = Builder::makeLocalSet
                          ((Builder *)&old,*pmVar19,
                           *(Expression **)
                            ((this_01->
                             super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                             ).
                             super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                             .stack.fixed._M_elems[0].func +
                            (long)((ulong)contents & 0xffffffff) * 8));
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)this_00,
                 (Expression *)pLVar22);
      uVar13 = (int)contents + 1;
    }
    pTVar21 = (this_02->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
              super__Vector_impl_data._M_start;
    pFVar14 = this_02;
    if ((this_02->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_finish != pTVar21) {
      pFVar35 = (Function *)0x0;
      do {
        TVar34.id = pTVar21[(long)pFVar35].id;
        auStack_98 = (undefined1  [8])TVar34.id;
        bVar11 = wasm::Type::isDefaultable((Type *)auStack_98);
        if (bVar11) {
          IVar12 = Function::getVarIndexBase(this_02);
          auStack_98._0_4_ = IVar12 + (int)pFVar35;
          pmVar19 = std::
                    map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                    ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                  *)&updater.module,(key_type *)auStack_98);
          IVar12 = *pmVar19;
          pEVar25 = LiteralUtils::makeZero(TVar34,local_b0);
          pLVar22 = Builder::makeLocalSet((Builder *)&old,IVar12,pEVar25);
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                    ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)this_00
                     ,(Expression *)pLVar22);
        }
        pFVar35 = (Function *)(ulong)((int)pFVar35 + 1);
        pTVar21 = (this_02->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pFVar14 = (Function *)
                  ((long)(this_02->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar21 >> 3);
      } while (pFVar35 < pFVar14);
    }
    if (*(char *)&(this_01->
                  super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                  ).
                  super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                  .stack.fixed._M_elems[3].func == '\0') {
      *action->callSite = left;
    }
    else {
      if (*(char *)((long)action + 0x10) == '\x01') {
        __assert_fail("!action.insideATry",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp"
                      ,0x23a,
                      "void wasm::(anonymous namespace)::doCodeInlining(Module *, Function *, const InliningAction &, PassOptions &)"
                     );
      }
      if ((ulong)local_a8 < 2) {
        pEVar25 = (Expression *)MixedArena::allocSpace((MixedArena *)(old + 0x20),0x18,8);
        pEVar25->_id = ReturnId;
        (pEVar25->type).id = 1;
        *(undefined8 *)(pEVar25 + 1) = 0;
        type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 0;
        type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pFVar14;
        pBVar20 = Builder::makeSequence((Builder *)&old,(Expression *)left,pEVar25,type_00);
      }
      else {
        pBVar20 = (Block *)MixedArena::allocSpace((MixedArena *)(old + 0x20),0x18,8);
        (pBVar20->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = ReturnId
        ;
        (pBVar20->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 1;
        (pBVar20->name).super_IString.str._M_len = (size_t)left;
      }
      *action->callSite = pBVar20;
    }
  }
  else {
    BranchUtils::BranchAccumulator::get((NameSet *)auStack_98,into->body);
    sVar38 = IString::interned((IString *)0xf,(string_view)ZEXT816(0xde3adb),SUB81(uVar28,0));
    local_150 = 0;
    local_140 = std::
                _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp:522:27)>
                ::_M_invoke;
    local_148 = std::
                _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp:522:27)>
                ::_M_manager;
    local_308[0] = local_2f8;
    local_158 = (NameSet *)auStack_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"_","");
    root_00.super_IString.str._M_str = (char *)&local_158;
    root_00.super_IString.str._M_len = (size_t)sVar38._M_str;
    sVar38 = (string_view)
             Names::getValidName((Names *)sVar38._M_len,root_00,(function<bool_(wasm::Name)> *)0x0,
                                 (Index)local_308,in_R9);
    if (local_308[0] != local_2f8) {
      operator_delete(local_308[0],local_2f8[0] + 1);
    }
    if (local_148 != (code *)0x0) {
      (*local_148)(&local_158,&local_158,3);
    }
    if ((ulong)local_a8 < 2) {
      local_138._0_8_ = into->body;
      local_138.type.id = (uintptr_t)MixedArena::allocSpace((MixedArena *)(old + 0x20),0x18,8);
      *(undefined1 *)local_138.type.id = 0x13;
      *(undefined8 *)(local_138.type.id + 8) = 1;
      *(undefined8 *)(local_138.type.id + 0x10) = 0;
      contents = &local_138;
      local_c8 = 2;
      in_R9 = (string *)0x1;
      pBVar20 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                          ((Builder *)&old,(Name)sVar38,
                           (initializer_list<wasm::Expression_*> *)&contents,
                           (optional<wasm::Type>)(ZEXT816(1) << 0x40));
    }
    else {
      pEVar25 = into->body;
      local_138._0_8_ = MixedArena::allocSpace((MixedArena *)(old + 0x20),0x18,8);
      ((Expression *)local_138._0_8_)->_id = ReturnId;
      (((Expression *)local_138._0_8_)->type).id = 1;
      *(Expression **)(local_138._0_8_ + 0x10) = pEVar25;
      contents = &local_138;
      local_c8 = 1;
      in_R9 = (string *)0x1;
      pBVar20 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                          ((Builder *)&old,(Name)sVar38,
                           (initializer_list<wasm::Expression_*> *)&contents,
                           (optional<wasm::Type>)(ZEXT816(1) << 0x40));
    }
    into->body = (Expression *)pBVar20;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 1;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = local_a8;
    pBVar20 = Builder::makeSequence((Builder *)&old,(Expression *)pBVar20,(Expression *)left,type);
    into->body = (Expression *)pBVar20;
    SVar37 = HeapType::getSignature(this);
    contents = (Expression *)SVar37.params.id;
    sVar17 = wasm::Type::size((Type *)&contents);
    this_03 = (MixedArena *)(old + 0x20);
    if (sVar17 == 0) {
      pBVar20 = (Block *)MixedArena::allocSpace(this_03,0x30,8);
      (pBVar20->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = BreakId;
      (pBVar20->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 1;
      (pBVar20->name).super_IString.str = sVar38;
      (pBVar20->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      data = (Expression **)0x0;
      (pBVar20->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements = 0;
      Break::finalize((Break *)pBVar20);
    }
    else {
      local_a0 = sVar38._M_str;
      pBVar20 = (Block *)MixedArena::allocSpace(this_03,0x40,8);
      (pBVar20->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = BlockId;
      (pBVar20->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
      (pBVar20->name).super_IString.str._M_len = 0;
      (pBVar20->name).super_IString.str._M_str = (char *)0x0;
      (pBVar20->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      data = (Expression **)0x0;
      (pBVar20->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements = 0;
      (pBVar20->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      allocatedElements = 0;
      (pBVar20->list).allocator = this_03;
      contents = (Expression *)((ulong)contents & 0xffffffff00000000);
      do {
        pmVar19 = std::
                  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                  ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                *)&updater.module,(key_type *)&contents);
        if ((this_01->
            super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
            ).
            super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
            .stack.fixed._M_elems[0].currp <= (Expression **)((ulong)contents & 0xffffffff)) {
LAB_008e934a:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        pLVar22 = Builder::makeLocalSet
                            ((Builder *)&old,*pmVar19,
                             *(Expression **)
                              ((this_01->
                               super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                               ).
                               super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                               .stack.fixed._M_elems[0].func +
                              (long)((ulong)contents & 0xffffffff) * 8));
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&(pBVar20->list).
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   (Expression *)pLVar22);
        uVar13 = (int)contents + 1;
        contents = (Expression *)CONCAT44(contents._4_4_,uVar13);
      } while (uVar13 < sVar17);
      pBVar23 = (Break *)MixedArena::allocSpace((MixedArena *)(old + 0x20),0x30,8);
      (pBVar23->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression._id = BreakId;
      (pBVar23->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 1;
      (pBVar23->name).super_IString.str._M_len = sVar38._M_len;
      (pBVar23->name).super_IString.str._M_str = local_a0;
      pBVar23->value = (Expression *)0x0;
      pBVar23->condition = (Expression *)0x0;
      Break::finalize(pBVar23);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&(pBVar20->list).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                 (Expression *)pBVar23);
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 1;
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)0x1;
      Block::finalize(pBVar20,type_,Unknown);
    }
    *action->callSite = (Expression *)pBVar20;
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)auStack_98);
  }
  auStack_98 = (undefined1  [8])0x0;
  __str._M_dataplus._M_p = (pointer)0x0;
  __str.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<wasm::Expression_*(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/manipulation.h:86:15)>
       ::_M_invoke;
  __str._M_string_length =
       (size_type)
       std::
       _Function_handler<wasm::Expression_*(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/manipulation.h:86:15)>
       ::_M_manager;
  local_d8 = (Block *)ExpressionManipulator::flexibleCopy
                                (this_02->body,local_b0,(CustomCopier *)auStack_98);
  if (__str._M_string_length != 0) {
    (*(code *)__str._M_string_length)(auStack_98,auStack_98,3);
  }
  debuginfo::copyBetweenFunctions(this_02->body,(Expression *)local_d8,this_02,into);
  if (((long)updater.
             super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
             .
             super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
             .
             super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
             .stack.flexible.
             super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start -
       (long)updater.
             super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
             .
             super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
             .
             super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
             .stack.fixed._M_elems[9].currp >> 4) +
      (long)updater.
            super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
            .
            super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
            .
            super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
            .replacep != 0) {
    __assert_fail("stack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                  ,0x12d,
                  "void wasm::Walker<wasm::(anonymous namespace)::Updater, wasm::Visitor<wasm::(anonymous namespace)::Updater>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::Updater, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::Updater>]"
                 );
  }
  Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  ::pushTask((Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
              *)auStack_2e8,
             TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
             ::scan,(Expression **)&local_d8);
  if (((long)updater.
             super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
             .
             super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
             .
             super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
             .stack.flexible.
             super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start -
       (long)updater.
             super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
             .
             super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
             .
             super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
             .stack.fixed._M_elems[9].currp >> 4) +
      (long)updater.
            super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
            .
            super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
            .
            super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
            .replacep != 0) {
    do {
      if ((pointer)updater.
                   super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                   .
                   super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                   .
                   super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                   .stack.fixed._M_elems[9].currp ==
          updater.
          super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
          .
          super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
          .
          super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
          .stack.flexible.
          super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        if (updater.
            super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
            .
            super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
            .
            super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
            .replacep == (Expression **)0x0) {
          __assert_fail("usedFixed > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                        ,0x7e,
                        "T &wasm::SmallVector<wasm::Walker<wasm::(anonymous namespace)::Updater, wasm::Visitor<wasm::(anonymous namespace)::Updater>>::Task, 10>::back() [T = wasm::Walker<wasm::(anonymous namespace)::Updater, wasm::Visitor<wasm::(anonymous namespace)::Updater>>::Task, N = 10]"
                       );
        }
        ppEVar32 = updater.
                   super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                   .
                   super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                   .
                   super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                   .stack.fixed._M_elems
                   [(long)updater.
                          super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                          .
                          super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                          .
                          super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                          .replacep + -2].currp;
        auStack_2e8 = (undefined1  [8])
                      updater.
                      super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                      .
                      super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                      .
                      super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                      .stack.fixed._M_elems
                      [(long)updater.
                             super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                             .
                             super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                             .
                             super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                             .replacep + -1].func;
        updater.
        super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
        .
        super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
        .
        super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
        .replacep = (Expression **)
                    ((long)updater.
                           super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                           .
                           super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                           .
                           super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                           .replacep + -1);
      }
      else {
        ppEVar32 = (Expression **)
                   updater.
                   super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                   .
                   super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                   .
                   super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                   .stack.flexible.
                   super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
                   ._M_impl.super__Vector_impl_data._M_start[-1].func;
        auStack_2e8 = (undefined1  [8])
                      updater.
                      super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                      .
                      super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                      .
                      super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                      .stack.flexible.
                      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
                      ._M_impl.super__Vector_impl_data._M_start[-1].currp;
        updater.
        super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
        .
        super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
        .
        super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
        .stack.flexible.
        super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start =
             updater.
             super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
             .
             super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
             .
             super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
             .stack.flexible.
             super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start + -1;
      }
      if (*(Expression **)auStack_2e8 == (Expression *)0x0) {
        __assert_fail("*task.currp",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                      ,0x132,
                      "void wasm::Walker<wasm::(anonymous namespace)::Updater, wasm::Visitor<wasm::(anonymous namespace)::Updater>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::Updater, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::Updater>]"
                     );
      }
      (*(code *)ppEVar32)((Updater *)auStack_2e8,(Expression **)auStack_2e8);
    } while (((long)updater.
                    super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                    .
                    super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                    .
                    super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                    .stack.flexible.
                    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start -
              (long)updater.
                    super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                    .
                    super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                    .
                    super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                    .stack.fixed._M_elems[9].currp >> 4) +
             (long)updater.
                   super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                   .
                   super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                   .
                   super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                   .replacep != 0);
  }
  if (updater.options !=
      (PassOptions *)
      updater.returnCallInfos.
      super__Vector_base<wasm::(anonymous_namespace)::Updater::ReturnCallInfo,_std::allocator<wasm::(anonymous_namespace)::Updater::ReturnCallInfo>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pfVar29 = (function<bool_(wasm::Name)> *)
              updater.
              super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
              .
              super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
              .
              super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
              .stack.flexible.
              super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((local_d8 == (Block *)0x0) ||
       (pBVar20 = local_d8,
       (local_d8->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id != BlockId
       )) {
      pBVar20 = Builder::makeBlock((Builder *)updater._304_8_,(Expression *)local_d8);
    }
    local_d8 = pBVar20;
    BranchUtils::BranchAccumulator::get((NameSet *)auStack_98,(Expression *)pBVar20);
    if ((PassOptions *)
        updater.returnCallInfos.
        super__Vector_base<wasm::(anonymous_namespace)::Updater::ReturnCallInfo,_std::allocator<wasm::(anonymous_namespace)::Updater::ReturnCallInfo>_>
        ._M_impl.super__Vector_impl_data._M_start != updater.options) {
      items = &pBVar20->list;
      local_58 = (function<bool_(wasm::Name)> *)0x0;
      name.field_2._8_8_ = action;
      do {
        pPVar7 = updater.options;
        sVar38 = IString::interned((IString *)0xd,(string_view)ZEXT816(0xde400c),SUB81(pfVar29,0));
        local_c8 = 0;
        local_b8 = std::
                   _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp:424:26)>
                   ::_M_invoke;
        local_c0 = std::
                   _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp:424:26)>
                   ::_M_manager;
        local_128._id = StackSwitchId;
        local_128._1_1_ = 0;
        local_138.type.id = 1;
        root_01.super_IString.str._M_str = (char *)&contents;
        root_01.super_IString.str._M_len = (size_t)sVar38._M_str;
        local_138._0_8_ = &local_128;
        contents = (Expression *)auStack_98;
        _auStack_118 = (string_view)
                       Names::getValidName((Names *)sVar38._M_len,root_01,local_58,(Index)&local_138
                                           ,in_R9);
        if ((Expression *)local_138._0_8_ != &local_128) {
          operator_delete((void *)local_138._0_8_,CONCAT62(local_128._2_6_,local_128._0_2_) + 1);
        }
        if (local_c0 != (code *)0x0) {
          (*local_c0)(&contents,&contents,3);
        }
        std::
        _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
        ::_M_insert_unique<wasm::Name_const&>
                  ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                    *)auStack_98,(Name *)auStack_118);
        lVar4 = *(long *)(&pPVar7->debug + (long)local_58 * 0x10 + 8);
        *(undefined1 (*) [8])(lVar4 + 0x10) = auStack_118;
        *(size_t *)(lVar4 + 0x18) = name_1.super_IString.str._M_len;
        type_02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 1;
        type_02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload =
             (_Storage<wasm::Type,_true>)
             (pBVar20->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id;
        pBVar24 = Builder::makeBlock<ArenaVector<wasm::Expression_*>,_true>
                            ((Builder *)updater._304_8_,items,type_02);
        sVar6 = updater.returnName.super_IString.str._M_len;
        sVar17 = updater.localMapping._M_t._M_impl.super__Rb_tree_header._M_node_count;
        (pBVar20->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
        usedElements = 0;
        if (updater.returnName.super_IString.str._M_str < (char *)0x2) {
          pBVar23 = (Break *)MixedArena::allocSpace
                                       ((MixedArena *)(*(long *)updater._304_8_ + 0x200),0x30,8);
          (pBVar23->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression._id =
               BreakId;
          (pBVar23->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 1;
          (pBVar23->name).super_IString.str._M_len = sVar17;
          (pBVar23->name).super_IString.str._M_str = (char *)sVar6;
          pBVar23->value = (Expression *)0x0;
          pBVar23->condition = (Expression *)0x0;
          Break::finalize(pBVar23);
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                    (&(pBVar24->list).
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                     (Expression *)pBVar23);
          (pBVar24->name).super_IString.str._M_len = (size_t)auStack_118;
          (pBVar24->name).super_IString.str._M_str = (char *)name_1.super_IString.str._M_len;
          (pBVar24->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                    (&items->
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                     (Expression *)pBVar24);
        }
        else {
          local_a0 = (char *)auStack_118;
          sVar8 = name_1.super_IString.str._M_len;
          local_b0 = (Module *)updater._304_8_;
          pBVar23 = (Break *)MixedArena::allocSpace
                                       ((MixedArena *)(*(long *)updater._304_8_ + 0x200),0x30,8);
          (pBVar23->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression._id =
               BreakId;
          (pBVar23->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 1;
          (pBVar23->name).super_IString.str._M_len = sVar17;
          (pBVar23->name).super_IString.str._M_str = (char *)sVar6;
          pBVar23->value = (Expression *)pBVar24;
          pBVar23->condition = (Expression *)0x0;
          Break::finalize(pBVar23);
          local_338._M_array =
               (iterator)
               &updater.returnCallInfos.
                super__Vector_base<wasm::(anonymous_namespace)::Updater::ReturnCallInfo,_std::allocator<wasm::(anonymous_namespace)::Updater::ReturnCallInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_338._M_len = 1;
          name_00.super_IString.str._M_str = (char *)sVar8;
          name_00.super_IString.str._M_len = (size_t)local_a0;
          in_R9 = (string *)0x1;
          updater.returnCallInfos.
          super__Vector_base<wasm::(anonymous_namespace)::Updater::ReturnCallInfo,_std::allocator<wasm::(anonymous_namespace)::Updater::ReturnCallInfo>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pBVar23;
          pBVar24 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                              ((Builder *)local_b0,name_00,&local_338,
                               (optional<wasm::Type>)(ZEXT816(1) << 0x40));
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                    (&items->
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                     (Expression *)pBVar24);
        }
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&items->
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   *(Expression **)(&pPVar7->debug + (long)local_58 * 0x10));
        type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 1;
        type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload =
             (_Storage<wasm::Type,_true>)updater.returnName.super_IString.str._M_str;
        Block::finalize(pBVar20,type__00,Unknown);
        pfVar29 = (function<bool_(wasm::Name)> *)(ulong)((int)local_58 + 1);
        action = (InliningAction *)name.field_2._8_8_;
        local_58 = pfVar29;
      } while (pfVar29 < (function<bool_(wasm::Name)> *)
                         ((long)updater.returnCallInfos.
                                super__Vector_base<wasm::(anonymous_namespace)::Updater::ReturnCallInfo,_std::allocator<wasm::(anonymous_namespace)::Updater::ReturnCallInfo>_>
                                ._M_impl.super__Vector_impl_data._M_start - (long)updater.options >>
                         4));
    }
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)auStack_98);
  }
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
             &left[1].super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type,
             (Expression *)local_d8);
  pTVar30->id = (uintptr_t)local_a8;
  if (((this_01->
       super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
       ).
       super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
       .stack.usedFixed == 1) &&
     (*(char *)&(this_01->
                super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                ).
                super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                .stack.fixed._M_elems[3].func == '\0')) {
    local_40 = left;
    if (1 < (ulong)local_a8) {
      local_40 = (Drop *)MixedArena::allocSpace((MixedArena *)(old + 0x20),0x18,8);
      (local_40->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
      (local_40->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
      local_40->value = (Expression *)left;
      Drop::finalize(local_40);
    }
    pEVar25 = (Expression *)MixedArena::allocSpace((MixedArena *)(old + 0x20),0x10,8);
    pEVar25->_id = UnreachableId;
    (pEVar25->type).id = 1;
    type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pTVar30;
    pBVar20 = Builder::makeSequence((Builder *)&old,(Expression *)local_40,pEVar25,type_01);
    *action->callSite = (Expression *)pBVar20;
  }
  if (updater.options != (PassOptions *)0x0) {
    operator_delete(updater.options,
                    (long)updater.returnCallInfos.
                          super__Vector_base<wasm::(anonymous_namespace)::Updater::ReturnCallInfo,_std::allocator<wasm::(anonymous_namespace)::Updater::ReturnCallInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)updater.options);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               *)&updater.module);
  if (updater.
      super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
      .stack.fixed._M_elems[9].currp != (Expression **)0x0) {
    operator_delete(updater.
                    super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                    .
                    super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                    .
                    super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                    .stack.fixed._M_elems[9].currp,
                    (long)updater.
                          super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                          .
                          super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                          .
                          super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                          .stack.flexible.
                          super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)updater.
                          super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                          .
                          super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                          .
                          super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                          .stack.fixed._M_elems[9].currp);
  }
  if ((size_type *)name_1.super_IString.str._M_str != &name._M_string_length) {
    operator_delete(name_1.super_IString.str._M_str,name._M_string_length + 1);
  }
  return;
}

Assistant:

static void doCodeInlining(Module* module,
                           Function* into,
                           const InliningAction& action,
                           PassOptions& options) {
  Function* from = action.contents;
  auto* call = (*action.callSite)->cast<Call>();

  // Works for return_call, too
  Type retType = module->getFunction(call->target)->getResults();

  // Build the block that will contain the inlined contents.
  Builder builder(*module);
  auto* block = builder.makeBlock();
  auto name = std::string("__inlined_func$") + from->name.toString();
  if (action.nameHint) {
    name += '$' + std::to_string(action.nameHint);
  }
  block->name = Name(name);

  // In the unlikely event that the function already has a branch target with
  // this name, fix that up, as otherwise we can get unexpected capture of our
  // branches, that is, we could end up with this:
  //
  //  (block $X             ;; a new block we add as the target of returns
  //    (from's contents
  //      (block $X         ;; a block in from's contents with a colliding name
  //        (br $X          ;; a new br we just added that replaces a return
  //
  // Here the br wants to go to the very outermost block, to represent a
  // return from the inlined function's code, but it ends up captured by an
  // internal block. We also need to be careful of the call's children:
  //
  //  (block $X             ;; a new block we add as the target of returns
  //    (local.set $param
  //      (call's first parameter
  //        (br $X)         ;; nested br in call's first parameter
  //      )
  //    )
  //
  // (In this case we could use a second block and define the named block $X
  // after the call's parameters, but that adds work for an extremely rare
  // situation.) The latter case does not apply if the call is a
  // return_call inside a try, because in that case the call's
  // children do not appear inside the same block as the inlined body.
  bool hoistCall = call->isReturn && action.insideATry;
  if (BranchUtils::hasBranchTarget(from->body, block->name) ||
      (!hoistCall && BranchUtils::BranchSeeker::has(call, block->name))) {
    auto fromNames = BranchUtils::getBranchTargets(from->body);
    auto callNames = hoistCall ? BranchUtils::NameSet{}
                               : BranchUtils::BranchAccumulator::get(call);
    block->name = Names::getValidName(block->name, [&](Name test) {
      return !fromNames.count(test) && !callNames.count(test);
    });
  }

  // Prepare to update the inlined code's locals and other things.
  Updater updater(options);
  updater.setFunction(into);
  updater.module = module;
  updater.resultType = from->getResults();
  updater.returnName = block->name;
  updater.isReturn = call->isReturn;
  updater.builder = &builder;
  // Set up a locals mapping
  for (Index i = 0; i < from->getNumLocals(); i++) {
    updater.localMapping[i] = builder.addVar(into, from->getLocalType(i));
  }

  if (hoistCall) {
    // Wrap the existing function body in a block we can branch out of before
    // entering the inlined function body. This block must have a name that is
    // different from any other block name above the branch.
    auto intoNames = BranchUtils::BranchAccumulator::get(into->body);
    auto bodyName =
      Names::getValidName(Name("__original_body"),
                          [&](Name test) { return !intoNames.count(test); });
    if (retType.isConcrete()) {
      into->body = builder.makeBlock(
        bodyName, {builder.makeReturn(into->body)}, Type::none);
    } else {
      into->body = builder.makeBlock(
        bodyName, {into->body, builder.makeReturn()}, Type::none);
    }

    // Sequence the inlined function body after the original caller body.
    into->body = builder.makeSequence(into->body, block, retType);

    // Replace the original callsite with an expression that assigns the
    // operands into the params and branches out of the original body.
    auto numParams = from->getParams().size();
    if (numParams) {
      auto* branchBlock = builder.makeBlock();
      for (Index i = 0; i < numParams; i++) {
        branchBlock->list.push_back(
          builder.makeLocalSet(updater.localMapping[i], call->operands[i]));
      }
      branchBlock->list.push_back(builder.makeBreak(bodyName));
      branchBlock->finalize(Type::unreachable);
      *action.callSite = branchBlock;
    } else {
      *action.callSite = builder.makeBreak(bodyName);
    }
  } else {
    // Assign the operands into the params
    for (Index i = 0; i < from->getParams().size(); i++) {
      block->list.push_back(
        builder.makeLocalSet(updater.localMapping[i], call->operands[i]));
    }
    // Zero out the vars (as we may be in a loop, and may depend on their
    // zero-init value
    for (Index i = 0; i < from->vars.size(); i++) {
      auto type = from->vars[i];
      if (!LiteralUtils::canMakeZero(type)) {
        // Non-zeroable locals do not need to be zeroed out. As they have no
        // zero value they by definition should not be used before being written
        // to, so any value we set here would not be observed anyhow.
        continue;
      }
      block->list.push_back(
        builder.makeLocalSet(updater.localMapping[from->getVarIndexBase() + i],
                             LiteralUtils::makeZero(type, *module)));
    }
    if (call->isReturn) {
      assert(!action.insideATry);
      if (retType.isConcrete()) {
        *action.callSite = builder.makeReturn(block);
      } else {
        *action.callSite = builder.makeSequence(block, builder.makeReturn());
      }
    } else {
      *action.callSite = block;
    }
  }

  // Generate and update the inlined contents
  auto* contents = ExpressionManipulator::copy(from->body, *module);
  debuginfo::copyBetweenFunctions(from->body, contents, from, into);
  updater.walk(contents);
  block->list.push_back(contents);
  block->type = retType;

  // The ReFinalize below will handle propagating unreachability if we need to
  // do so, that is, if the call was reachable but now the inlined content we
  // replaced it with was unreachable. The opposite case requires special
  // handling: ReFinalize works under the assumption that code can become
  // unreachable, but it does not go back from that state. But inlining can
  // cause that:
  //
  //  (call $A                               ;; an unreachable call
  //    (unreachable)
  //  )
  // =>
  //  (block $__inlined_A_body (result i32)  ;; reachable code after inlining
  //    (unreachable)
  //  )
  //
  // That is, if the called function wraps the input parameter in a block with a
  // declared type, then the block is not unreachable. And then we might error
  // if the outside expects the code to be unreachable - perhaps it only
  // validates that way. To fix this, if the call was unreachable then we make
  // the inlined code unreachable as well. That also maximizes DCE
  // opportunities by propagating unreachability as much as possible.
  //
  // (Note that we don't need to do this for a return_call, which is always
  // unreachable anyhow.)
  if (call->type == Type::unreachable && !call->isReturn) {
    // Make the replacement code unreachable. Note that we can't just add an
    // unreachable at the end, as the block might have breaks to it (returns are
    // transformed into those).
    Expression* old = block;
    if (old->type.isConcrete()) {
      old = builder.makeDrop(old);
    }
    *action.callSite = builder.makeSequence(old, builder.makeUnreachable());
  }
}